

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendScannerProfile
               (cmGeneratedFileStream *fout,string *profileID,bool openActionEnabled,
               string *openActionFilePath,bool pParserEnabled,string *scannerInfoProviderID,
               string *runActionArguments,string *runActionCommand,bool runActionUseDefault,
               bool sipParserEnabled)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  char *pcVar2;
  char *pcVar3;
  undefined3 in_register_00000081;
  
  poVar1 = std::operator<<((ostream *)fout,"<profile id=\"");
  poVar1 = std::operator<<(poVar1,(string *)profileID);
  poVar1 = std::operator<<(poVar1,"\">\n<buildOutputProvider>\n<openAction enabled=\"");
  pcVar2 = "false";
  pcVar3 = "false";
  if (CONCAT31(in_register_00000011,openActionEnabled) != 0) {
    pcVar3 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"\" filePath=\"");
  poVar1 = std::operator<<(poVar1,(string *)openActionFilePath);
  poVar1 = std::operator<<(poVar1,"\"/>\n<parser enabled=\"");
  pcVar3 = "false";
  if (CONCAT31(in_register_00000081,pParserEnabled) != 0) {
    pcVar3 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"\"/>\n</buildOutputProvider>\n<scannerInfoProvider id=\"");
  poVar1 = std::operator<<(poVar1,(string *)scannerInfoProviderID);
  poVar1 = std::operator<<(poVar1,"\">\n<runAction arguments=\"");
  poVar1 = std::operator<<(poVar1,(string *)runActionArguments);
  poVar1 = std::operator<<(poVar1,"\" command=\"");
  poVar1 = std::operator<<(poVar1,(string *)runActionCommand);
  poVar1 = std::operator<<(poVar1,"\" useDefault=\"");
  pcVar3 = "false";
  if (runActionUseDefault) {
    pcVar3 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"\"/>\n<parser enabled=\"");
  if (sipParserEnabled) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\"/>\n</scannerInfoProvider>\n</profile>\n");
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendScannerProfile(cmGeneratedFileStream& fout,
                       const std::string&     profileID,
                       bool                   openActionEnabled,
                       const std::string&     openActionFilePath,
                       bool                   pParserEnabled,
                       const std::string&     scannerInfoProviderID,
                       const std::string&     runActionArguments,
                       const std::string&     runActionCommand,
                       bool                   runActionUseDefault,
                       bool                   sipParserEnabled)
{
  fout <<
    "<profile id=\"" << profileID << "\">\n"
    "<buildOutputProvider>\n"
    "<openAction enabled=\"" << (openActionEnabled ? "true" : "false")
    << "\" filePath=\"" << openActionFilePath << "\"/>\n"
    "<parser enabled=\"" << (pParserEnabled ? "true" : "false") << "\"/>\n"
    "</buildOutputProvider>\n"
    "<scannerInfoProvider id=\"" << scannerInfoProviderID << "\">\n"
    "<runAction arguments=\"" << runActionArguments << "\""
    " command=\"" << runActionCommand
    << "\" useDefault=\"" << (runActionUseDefault ? "true":"false") << "\"/>\n"
    "<parser enabled=\"" << (sipParserEnabled ? "true" : "false") << "\"/>\n"
    "</scannerInfoProvider>\n"
    "</profile>\n"
    ;
}